

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O3

TreeOrError * __thiscall
slang::syntax::SyntaxTree::fromFiles
          (TreeOrError *__return_storage_ptr__,SyntaxTree *this,
          span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
          paths,SourceManager *sourceManager,Bag *options)

{
  char *pcVar1;
  path *this_00;
  pointer pbVar2;
  long lVar3;
  span<const_slang::SourceBuffer,_18446744073709551615UL> sources;
  MacroList inheritedMacros;
  basic_string_view<char,_std::char_traits<char>_> path;
  BufferOrError buffer;
  SmallVector<slang::SourceBuffer,_4UL> buffers;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  undefined8 local_148;
  undefined8 uStack_140;
  element_type *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_130;
  size_t local_128;
  char *pcStack_120;
  undefined1 local_118 [80];
  SmallVector<slang::SourceBuffer,_4UL> local_c8;
  
  pbVar2 = paths._M_ptr;
  SmallVector<slang::SourceBuffer,_4UL>::SmallVector(&local_c8,pbVar2);
  if (pbVar2 != (pointer)0x0) {
    lVar3 = 0;
    this_00 = (path *)(local_118 + 0x28);
    do {
      pcVar1 = (this->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
               super_SmallVectorBase<slang::Diagnostic>.firstElement + lVar3 + -0x48;
      local_158._M_len = *(size_t *)pcVar1;
      local_158._M_str = *(char **)(pcVar1 + 8);
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (this_00,&local_158,auto_format);
      SourceManager::readSource
                ((BufferOrError *)local_118,
                 (SourceManager *)paths._M_extent._M_extent_value._M_extent_value,this_00,
                 (SourceLibrary *)0x0,0xffffffffffffffff);
      std::filesystem::__cxx11::path::~path(this_00);
      if (local_118[0x20] == '\0') {
        local_138 = (element_type *)local_118._0_8_;
        p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
        local_128 = local_158._M_len;
        pcStack_120 = local_158._M_str;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        .m_has_value = false;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_118._0_8_;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        .field_0.m_error.second._M_len = local_158._M_len;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        .field_0.m_error.second._M_str = local_158._M_str;
        goto LAB_001cd889;
      }
      SmallVectorBase<slang::SourceBuffer>::emplace_back<slang::SourceBuffer_const&>
                (&local_c8.super_SmallVectorBase<slang::SourceBuffer>,(SourceBuffer *)local_118);
      lVar3 = lVar3 + 0x10;
    } while ((long)pbVar2 << 4 != lVar3);
  }
  local_148 = 0;
  uStack_140 = 0;
  sources._M_extent._M_extent_value =
       (size_t)local_c8.super_SmallVectorBase<slang::SourceBuffer>.data_;
  sources._M_ptr = (pointer)paths._M_extent._M_extent_value._M_extent_value;
  inheritedMacros._M_extent._M_extent_value = 0;
  inheritedMacros._M_ptr = (pointer)sourceManager;
  create((SourceManager *)local_118,sources,
         (Bag *)local_c8.super_SmallVectorBase<slang::SourceBuffer>.len,inheritedMacros,false);
  (__return_storage_ptr__->contained).
  super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  .m_has_value = true;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)local_118._0_8_;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
LAB_001cd889:
  if (local_c8.super_SmallVectorBase<slang::SourceBuffer>.data_ !=
      (pointer)local_c8.super_SmallVectorBase<slang::SourceBuffer>.firstElement) {
    operator_delete(local_c8.super_SmallVectorBase<slang::SourceBuffer>.data_);
  }
  return __return_storage_ptr__;
}

Assistant:

SyntaxTree::TreeOrError SyntaxTree::fromFiles(std::span<const std::string_view> paths,
                                              SourceManager& sourceManager, const Bag& options) {
    SmallVector<SourceBuffer, 4> buffers(paths.size(), UninitializedTag());
    for (auto path : paths) {
        auto buffer = sourceManager.readSource(path, /* library */ nullptr);
        if (!buffer)
            return nonstd::make_unexpected(std::pair{buffer.error(), path});

        buffers.push_back(*buffer);
    }

    return create(sourceManager, buffers, options, {}, false);
}